

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_subgroup_op(CompilerGLSL *this,Instruction *i)

{
  Scope SVar1;
  Scope result_type_00;
  bool bVar2;
  uint32_t uVar3;
  CompilerError *pCVar4;
  uint32_t direction;
  GroupOperation operation_22;
  GroupOperation operation_21;
  GroupOperation operation_20;
  GroupOperation operation_19;
  GroupOperation operation_18;
  GroupOperation operation_17;
  GroupOperation operation_16;
  GroupOperation operation_15;
  GroupOperation operation_14;
  GroupOperation operation_13;
  GroupOperation operation_12;
  GroupOperation operation_11;
  GroupOperation operation_10;
  GroupOperation operation_9;
  GroupOperation operation_8;
  GroupOperation operation_7;
  GroupOperation operation_6;
  uint32_t local_1c8;
  Scope local_1c4;
  Scope scope;
  uint32_t id;
  uint32_t result_type;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  Scope local_148;
  allocator local_141;
  GroupOperation operation_5;
  Scope local_120;
  allocator local_119;
  GroupOperation operation_4;
  Scope local_f8;
  allocator local_f1;
  GroupOperation operation_3;
  Scope local_d0;
  allocator local_c9;
  GroupOperation operation_2;
  Scope local_a4;
  SPIRType *pSStack_a0;
  GroupOperation operation_1;
  SPIRType *type;
  string local_90;
  allocator local_69;
  string local_68;
  Scope local_44;
  BaseType local_40;
  GroupOperation operation;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  Op local_24;
  Scope *pSStack_20;
  Op op;
  uint32_t *ops;
  Instruction *i_local;
  CompilerGLSL *this_local;
  
  ops = (uint32_t *)i;
  i_local = (Instruction *)this;
  pSStack_20 = Compiler::stream(&this->super_Compiler,i);
  local_24 = (Op)(ushort)*ops;
  if ((((this->options).vulkan_semantics & 1U) == 0) &&
     (bVar2 = is_supported_subgroup_op_in_opengl(local_24,pSStack_20), !bVar2)) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar4,"This subgroup operation is only supported in Vulkan semantics.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uint_type = get_integer_width_for_instruction(this,(Instruction *)ops);
  operation = to_signed_basetype(uint_type);
  local_40 = to_unsigned_basetype(uint_type);
  switch(local_24) {
  case OpGroupNonUniformElect:
    request_subgroup_feature(this,SubgroupElect);
    break;
  case OpGroupNonUniformAll:
  case OpGroupNonUniformAny:
  case OpGroupNonUniformAllEqual:
    pSStack_a0 = Compiler::expression_type(&this->super_Compiler,pSStack_20[3]);
    if ((pSStack_a0->basetype == Boolean) && (pSStack_a0->vecsize == 1)) {
      request_subgroup_feature(this,SubgroupAll_Any_AllEqualBool);
    }
    else {
      request_subgroup_feature(this,SubgroupAllEqualT);
    }
    break;
  case OpGroupNonUniformBroadcast:
  case OpGroupNonUniformBroadcastFirst:
    request_subgroup_feature(this,SubgroupBroadcast_First);
    break;
  case OpGroupNonUniformBallot:
    request_subgroup_feature(this,SubgroupBallot);
    break;
  case OpGroupNonUniformInverseBallot:
    request_subgroup_feature(this,SubgroupInverseBallot_InclBitCount_ExclBitCout);
    break;
  case OpGroupNonUniformBallotBitExtract:
    request_subgroup_feature(this,SubgroupBallotBitExtract);
    break;
  case OpGroupNonUniformBallotBitCount:
    local_44 = pSStack_20[3];
    if (local_44 == CrossDevice) {
      request_subgroup_feature(this,SubgroupBallotBitCount);
    }
    else if ((local_44 == Device) || (local_44 == ScopeWorkgroup)) {
      request_subgroup_feature(this,SubgroupInverseBallot_InclBitCount_ExclBitCout);
    }
    break;
  case OpGroupNonUniformBallotFindLSB:
  case OpGroupNonUniformBallotFindMSB:
    request_subgroup_feature(this,SubgroupBallotFindLSB_MSB);
    break;
  case OpGroupNonUniformShuffle:
  case OpGroupNonUniformShuffleXor:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_68,"GL_KHR_shader_subgroup_shuffle",&local_69);
    require_extension_internal(this,&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    break;
  case OpGroupNonUniformShuffleUp:
  case OpGroupNonUniformShuffleDown:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_90,"GL_KHR_shader_subgroup_shuffle_relative",
               (allocator *)((long)&type + 7));
    require_extension_internal(this,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
    break;
  case OpGroupNonUniformIAdd:
    local_a4 = pSStack_20[3];
    if (local_a4 == ScopeSubgroup) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&operation_2,"GL_KHR_shader_subgroup_clustered",&local_c9);
      require_extension_internal(this,(string *)&operation_2);
      ::std::__cxx11::string::~string((string *)&operation_2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    else if (local_a4 == CrossDevice) {
      request_subgroup_feature(this,SubgroupArithmeticIAddReduce);
    }
    else if (local_a4 == ScopeWorkgroup) {
      request_subgroup_feature(this,SubgroupArithmeticIAddExclusiveScan);
    }
    else {
      if (local_a4 != Device) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      request_subgroup_feature(this,SubgroupArithmeticIAddInclusiveScan);
    }
    break;
  case OpGroupNonUniformFAdd:
    local_d0 = pSStack_20[3];
    if (local_d0 == ScopeSubgroup) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&operation_3,"GL_KHR_shader_subgroup_clustered",&local_f1);
      require_extension_internal(this,(string *)&operation_3);
      ::std::__cxx11::string::~string((string *)&operation_3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    else if (local_d0 == CrossDevice) {
      request_subgroup_feature(this,SubgroupArithmeticFAddReduce);
    }
    else if (local_d0 == ScopeWorkgroup) {
      request_subgroup_feature(this,SubgroupArithmeticFAddExclusiveScan);
    }
    else {
      if (local_d0 != Device) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      request_subgroup_feature(this,SubgroupArithmeticFAddInclusiveScan);
    }
    break;
  case OpGroupNonUniformIMul:
    local_f8 = pSStack_20[3];
    if (local_f8 == ScopeSubgroup) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&operation_4,"GL_KHR_shader_subgroup_clustered",&local_119);
      require_extension_internal(this,(string *)&operation_4);
      ::std::__cxx11::string::~string((string *)&operation_4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    else if (local_f8 == CrossDevice) {
      request_subgroup_feature(this,SubgroupArithmeticIMulReduce);
    }
    else if (local_f8 == ScopeWorkgroup) {
      request_subgroup_feature(this,SubgroupArithmeticIMulExclusiveScan);
    }
    else {
      if (local_f8 != Device) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      request_subgroup_feature(this,SubgroupArithmeticIMulInclusiveScan);
    }
    break;
  case OpGroupNonUniformFMul:
    local_120 = pSStack_20[3];
    if (local_120 == ScopeSubgroup) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&operation_5,"GL_KHR_shader_subgroup_clustered",&local_141);
      require_extension_internal(this,(string *)&operation_5);
      ::std::__cxx11::string::~string((string *)&operation_5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    else if (local_120 == CrossDevice) {
      request_subgroup_feature(this,SubgroupArithmeticFMulReduce);
    }
    else if (local_120 == ScopeWorkgroup) {
      request_subgroup_feature(this,SubgroupArithmeticFMulExclusiveScan);
    }
    else {
      if (local_120 != Device) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      request_subgroup_feature(this,SubgroupArithmeticFMulInclusiveScan);
    }
    break;
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
  case OpGroupNonUniformLogicalAnd:
  case OpGroupNonUniformLogicalOr:
  case OpGroupNonUniformLogicalXor:
    local_148 = pSStack_20[3];
    if (local_148 == ScopeSubgroup) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_168,"GL_KHR_shader_subgroup_clustered",&local_169);
      require_extension_internal(this,&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
    else {
      if (((local_148 != ScopeWorkgroup) && (local_148 != Device)) && (local_148 != CrossDevice)) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_190,"GL_KHR_shader_subgroup_arithmetic",&local_191);
      require_extension_internal(this,&local_190);
      ::std::__cxx11::string::~string((string *)&local_190);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    break;
  case OpGroupNonUniformQuadBroadcast:
  case OpGroupNonUniformQuadSwap:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&result_type,"GL_KHR_shader_subgroup_quad",(allocator *)((long)&id + 3));
    require_extension_internal(this,(string *)&result_type);
    ::std::__cxx11::string::~string((string *)&result_type);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&id + 3));
    break;
  default:
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Invalid opcode for subgroup.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  scope = *pSStack_20;
  local_1c4 = pSStack_20[1];
  local_1c8 = Compiler::evaluate_constant_u32(&this->super_Compiler,pSStack_20[2]);
  result_type_00 = scope;
  SVar1 = local_1c4;
  if (local_1c8 != 3) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Only subgroup scope is supported.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(local_24) {
  case OpGroupNonUniformElect:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&operation_6,"subgroupElect()",(allocator *)((long)&operation_7 + 3));
    emit_op(this,result_type_00,SVar1,(string *)&operation_6,true,false);
    ::std::__cxx11::string::~string((string *)&operation_6);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&operation_7 + 3));
    break;
  case OpGroupNonUniformAll:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupAll");
    break;
  case OpGroupNonUniformAny:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupAny");
    break;
  case OpGroupNonUniformAllEqual:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupAllEqual");
    break;
  case OpGroupNonUniformBroadcast:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupBroadcast");
    break;
  case OpGroupNonUniformBroadcastFirst:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupBroadcastFirst");
    break;
  case OpGroupNonUniformBallot:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupBallot");
    break;
  case OpGroupNonUniformInverseBallot:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupInverseBallot");
    break;
  case OpGroupNonUniformBallotBitExtract:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupBallotBitExtract")
    ;
    break;
  case OpGroupNonUniformBallotBitCount:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupBallotBitCount");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupBallotInclusiveBitCount");
    }
    else {
      if (SVar1 != ScopeWorkgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid BitCount operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupBallotExclusiveBitCount");
    }
    break;
  case OpGroupNonUniformBallotFindLSB:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupBallotFindLSB");
    break;
  case OpGroupNonUniformBallotFindMSB:
    emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupBallotFindMSB");
    break;
  case OpGroupNonUniformShuffle:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupShuffle");
    break;
  case OpGroupNonUniformShuffleXor:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupShuffleXor");
    break;
  case OpGroupNonUniformShuffleUp:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupShuffleUp");
    break;
  case OpGroupNonUniformShuffleDown:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupShuffleDown");
    break;
  case OpGroupNonUniformIAdd:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupAdd");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveAdd");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveAdd");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredAdd");
    }
    break;
  case OpGroupNonUniformFAdd:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupAdd");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveAdd");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveAdd");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredAdd");
    }
    break;
  case OpGroupNonUniformIMul:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupMul");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMul");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMul");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMul");
    }
    break;
  case OpGroupNonUniformFMul:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupMul");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMul");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMul");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMul");
    }
    break;
  case OpGroupNonUniformSMin:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op_cast(this,scope,local_1c4,pSStack_20[4],"subgroupMin",operation,operation);
    }
    else if (SVar1 == Device) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMin",operation,operation);
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMin",operation,operation);
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMin",operation);
    }
    break;
  case OpGroupNonUniformUMin:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op_cast(this,scope,local_1c4,pSStack_20[4],"subgroupMin",local_40,local_40);
    }
    else if (SVar1 == Device) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMin",local_40,local_40);
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMin",local_40,local_40);
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMin",local_40);
    }
    break;
  case OpGroupNonUniformFMin:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupMin");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMin");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMin");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMin");
    }
    break;
  case OpGroupNonUniformSMax:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op_cast(this,scope,local_1c4,pSStack_20[4],"subgroupMax",operation,operation);
    }
    else if (SVar1 == Device) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMax",operation,operation);
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMax",operation,operation);
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMax",operation);
    }
    break;
  case OpGroupNonUniformUMax:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op_cast(this,scope,local_1c4,pSStack_20[4],"subgroupMax",local_40,local_40);
    }
    else if (SVar1 == Device) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMax",local_40,local_40);
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMax",local_40,local_40);
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMax",local_40);
    }
    break;
  case OpGroupNonUniformFMax:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupMax");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveMax");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveMax");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredMax");
    }
    break;
  case OpGroupNonUniformBitwiseAnd:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupAnd");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveAnd");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveAnd");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredAnd");
    }
    break;
  case OpGroupNonUniformBitwiseOr:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupOr");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveOr");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveOr");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredOr");
    }
    break;
  case OpGroupNonUniformBitwiseXor:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupXor");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveXor");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveXor");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredXor");
    }
    break;
  case OpGroupNonUniformLogicalAnd:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupAnd");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveAnd");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveAnd");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredAnd");
    }
    break;
  case OpGroupNonUniformLogicalOr:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupOr");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveOr");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveOr");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredOr");
    }
    break;
  case OpGroupNonUniformLogicalXor:
    SVar1 = pSStack_20[3];
    if (SVar1 == CrossDevice) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupXor");
    }
    else if (SVar1 == Device) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupInclusiveXor");
    }
    else if (SVar1 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[4],"subgroupExclusiveXor");
    }
    else {
      if (SVar1 != ScopeSubgroup) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid group operation.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_1c4,pSStack_20[4],pSStack_20[5],"subgroupClusteredXor");
    }
    break;
  case OpGroupNonUniformQuadBroadcast:
    emit_binary_func_op(this,scope,local_1c4,pSStack_20[3],pSStack_20[4],"subgroupQuadBroadcast");
    break;
  case OpGroupNonUniformQuadSwap:
    uVar3 = Compiler::evaluate_constant_u32(&this->super_Compiler,pSStack_20[4]);
    if (uVar3 == 0) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupQuadSwapHorizontal");
    }
    else if (uVar3 == 1) {
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupQuadSwapVertical");
    }
    else {
      if (uVar3 != 2) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Invalid quad swap direction.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_unary_func_op(this,scope,local_1c4,pSStack_20[3],"subgroupQuadSwapDiagonal");
    }
    break;
  default:
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Invalid opcode for subgroup.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  register_control_dependent_expression(this,local_1c4);
  return;
}

Assistant:

void CompilerGLSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (!options.vulkan_semantics && !is_supported_subgroup_op_in_opengl(op, ops))
		SPIRV_CROSS_THROW("This subgroup operation is only supported in Vulkan semantics.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case OpGroupNonUniformElect:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupElect);
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitCount);
		else if (operation == GroupOperationInclusiveScan || operation == GroupOperationExclusiveScan)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
	}
	break;

	case OpGroupNonUniformBallotBitExtract:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitExtract);
		break;

	case OpGroupNonUniformInverseBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
		break;

	case OpGroupNonUniformBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallot);
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotFindLSB_MSB);
		break;

	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBroadcast_First);
		break;

	case OpGroupNonUniformShuffle:
	case OpGroupNonUniformShuffleXor:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle");
		break;

	case OpGroupNonUniformShuffleUp:
	case OpGroupNonUniformShuffleDown:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle_relative");
		break;

	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	{
		const SPIRType &type = expression_type(ops[3]);
		if (type.basetype == SPIRType::BaseType::Boolean && type.vecsize == 1u)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAll_Any_AllEqualBool);
		else
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAllEqualT);
	}
	break;

	// clang-format off
#define GLSL_GROUP_OP(OP)\
	case OpGroupNonUniform##OP:\
	{\
		auto operation = static_cast<GroupOperation>(ops[3]);\
		if (operation == GroupOperationClusteredReduce)\
			require_extension_internal("GL_KHR_shader_subgroup_clustered");\
		else if (operation == GroupOperationReduce)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##Reduce);\
		else if (operation == GroupOperationExclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##ExclusiveScan);\
		else if (operation == GroupOperationInclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##InclusiveScan);\
		else\
			SPIRV_CROSS_THROW("Invalid group operation.");\
		break;\
	}

	GLSL_GROUP_OP(IAdd)
	GLSL_GROUP_OP(FAdd)
	GLSL_GROUP_OP(IMul)
	GLSL_GROUP_OP(FMul)

#undef GLSL_GROUP_OP
	// clang-format on

	case OpGroupNonUniformFMin:
	case OpGroupNonUniformFMax:
	case OpGroupNonUniformSMin:
	case OpGroupNonUniformSMax:
	case OpGroupNonUniformUMin:
	case OpGroupNonUniformUMax:
	case OpGroupNonUniformBitwiseAnd:
	case OpGroupNonUniformBitwiseOr:
	case OpGroupNonUniformBitwiseXor:
	case OpGroupNonUniformLogicalAnd:
	case OpGroupNonUniformLogicalOr:
	case OpGroupNonUniformLogicalXor:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationClusteredReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_clustered");
		}
		else if (operation == GroupOperationExclusiveScan || operation == GroupOperationInclusiveScan ||
		         operation == GroupOperationReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_arithmetic");
		}
		else
			SPIRV_CROSS_THROW("Invalid group operation.");
		break;
	}

	case OpGroupNonUniformQuadSwap:
	case OpGroupNonUniformQuadBroadcast:
		require_extension_internal("GL_KHR_shader_subgroup_quad");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "subgroupElect()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupInverseBallot");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAll");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAny");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAllEqual");
		break;

		// clang-format off
#define GLSL_GROUP_OP(op, glsl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "subgroup" #glsl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupInclusive" #glsl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupExclusive" #glsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define GLSL_GROUP_OP_CAST(op, glsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroup" #glsl_op, type, type); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupInclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupExclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op_cast_clustered(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	GLSL_GROUP_OP(FAdd, Add)
	GLSL_GROUP_OP(FMul, Mul)
	GLSL_GROUP_OP(FMin, Min)
	GLSL_GROUP_OP(FMax, Max)
	GLSL_GROUP_OP(IAdd, Add)
	GLSL_GROUP_OP(IMul, Mul)
	GLSL_GROUP_OP_CAST(SMin, Min, int_type)
	GLSL_GROUP_OP_CAST(SMax, Max, int_type)
	GLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	GLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	GLSL_GROUP_OP(BitwiseAnd, And)
	GLSL_GROUP_OP(BitwiseOr, Or)
	GLSL_GROUP_OP(BitwiseXor, Xor)
	GLSL_GROUP_OP(LogicalAnd, And)
	GLSL_GROUP_OP(LogicalOr, Or)
	GLSL_GROUP_OP(LogicalXor, Xor)
#undef GLSL_GROUP_OP
#undef GLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapHorizontal");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapVertical");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupQuadBroadcast");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}